

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::BasicSolver::InitMetaInfoAndOptions::BoolOption::SetValue(BoolOption *this,LongLong value)

{
  BasicStringRef<char> *this_00;
  char *in_RSI;
  long in_RDI;
  longlong in_stack_00000008;
  InvalidOptionValue *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  StringRef in_stack_00000028;
  char *in_stack_ffffffffffffffa8;
  
  if ((in_RSI != (char *)0x0) && (in_RSI != (char *)0x1)) {
    this_00 = (BasicStringRef<char> *)__cxa_allocate_exception(0x18);
    SolverOption::name((SolverOption *)0x4f29c9);
    fmt::BasicStringRef<char>::BasicStringRef(this_00,in_stack_ffffffffffffffa8);
    fmt::BasicStringRef<char>::BasicStringRef(this_00,in_RSI);
    InvalidOptionValue::InvalidOptionValue<long_long>
              (in_stack_00000010,in_stack_00000028,in_stack_00000008,(StringRef)in_stack_00000018);
    __cxa_throw(this_00,&InvalidOptionValue::typeinfo,InvalidOptionValue::~InvalidOptionValue);
  }
  *(bool *)*(undefined8 *)(in_RDI + 0xd0) = in_RSI != (char *)0x0;
  return;
}

Assistant:

void SetValue(fmt::LongLong value) {
      if (value != 0 && value != 1)
        throw InvalidOptionValue(name(), value);
      value_ = value != 0;
    }